

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O2

char dspl_Victory(void)

{
  char cVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  timespec local_40;
  
  if (_stdscr == 0) {
    iVar6 = -1;
  }
  else {
    iVar6 = *(short *)(_stdscr + 4) + 1;
  }
  cbreak();
  nodelay();
  FlyingCard.m_enabled = true;
  iVar7 = -7;
  if (-7 < iVar6) {
    iVar7 = iVar6;
  }
  cVar2 = '\0';
  do {
    if ('\0' < cVar2) {
      FlyingCard.m_enabled = false;
      nodelay(_stdscr,0);
      return cVar2;
    }
    iVar3 = rand();
    FlyingCard.m_dirX = iVar3 % 7 + -3;
    iVar3 = rand();
    FlyingCard.m_x = iVar3 % 0x3c;
    uVar4 = rand();
    bVar8 = (uVar4 & 1) != 0;
    FlyingCard.m_dirY = (bVar8 - 1) + (uint)bVar8;
    FlyingCard.m_y = -7;
    if (!bVar8) {
      FlyingCard.m_y = iVar6;
    }
    iVar3 = rand();
    FlyingCard.m_card.m_color = iVar3 % 4;
    iVar3 = rand();
    FlyingCard.m_card.m_type = iVar3 % 0xd + CT_ACE;
    iVar3 = rand();
    FlyingCard.m_card.m_face = (ECardFace_t)(iVar3 % 5 != 0);
    iVar5 = rand();
    cVar1 = cVar2;
    iVar3 = iVar7 + 8;
    do {
      cVar2 = cVar1;
      iVar3 = iVar3 + -1;
      if (iVar3 == 0) break;
      if (FlyingCard.m_enabled == true) {
        FlyingCard.m_x = FlyingCard.m_x + FlyingCard.m_dirX;
        if (0x3c < (uint)FlyingCard.m_x) {
          FlyingCard.m_dirX = -FlyingCard.m_dirX;
        }
        FlyingCard.m_y = FlyingCard.m_y + FlyingCard.m_dirY;
      }
      dspl_Render(CMD_NONE);
      local_40.tv_sec = 0;
      local_40.tv_nsec = (long)((iVar5 % 0x32) * 1000000 + 10000000);
      nanosleep(&local_40,(timespec *)0x0);
      cVar2 = input_ReadKey();
      cVar1 = '\0';
    } while (cVar2 == '\0');
  } while( true );
}

Assistant:

char dspl_Victory(void)
{
  int maxX = getmaxy(stdscr);
  char key = 0;

  cbreak();
  nodelay(stdscr, TRUE);

  FlyingCard.m_enabled = true;
  while (key <= 0) {
    ResetFlying(maxX);
    int sleepTime = (rand() % 50) + 10;
    for (int i = 0; i < (maxX + CARD_HEIGHT); i++) {
      MoveFlying();
      dspl_Render(CMD_NONE);
      SleepMs(sleepTime);

      key = input_ReadKey();
      if (key) {
        break;
      }
    }
  }
  FlyingCard.m_enabled = false;

  nodelay(stdscr, FALSE);

  return key;
}